

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffArrayExpr(NodeDiffComputer *this,ArrayExpr *lhs,ArrayExpr *rhs)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = (lhs->_inits)._size - (rhs->_inits)._size;
  if (iVar1 == 0) {
    if ((lhs->_inits)._size == 0) {
      iVar3 = 0;
    }
    else {
      uVar5 = 0;
      iVar3 = 0;
      do {
        iVar2 = diffNodes(this,&(lhs->_inits)._vals[uVar5]->super_Node,
                          &(rhs->_inits)._vals[uVar5]->super_Node);
        if (this->limit < iVar2) {
          return iVar2;
        }
        iVar3 = iVar3 + iVar2;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (lhs->_inits)._size);
    }
  }
  else {
    iVar4 = -iVar1;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    iVar3 = iVar4 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar3;
}

Assistant:

int32_t diffArrayExpr(const ArrayExpr *lhs, const ArrayExpr *rhs) {
    const auto &leftInits = lhs->initializers();
    const auto &rightInits = rhs->initializers();

    if (leftInits.size() != rightInits.size())
      return sizeDiff(leftInits.size(), rightInits.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftInits.size(); ++i) {
      const Expr *l = leftInits[i];
      const Expr *r = rightInits[i];

      int32_t tmp = diffNodes(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }